

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3_result_error(sqlite3_context *pCtx,char *z,int n)

{
  pCtx->isError = 1;
  sqlite3VdbeMemSetStr(pCtx->pOut,z,(long)n,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
  return;
}

Assistant:

SQLITE_API void sqlite3_result_error(sqlite3_context *pCtx, const char *z, int n){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCtx==0 ) return;
#endif
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
  pCtx->isError = SQLITE_ERROR;
  sqlite3VdbeMemSetStr(pCtx->pOut, z, n, SQLITE_UTF8, SQLITE_TRANSIENT);
}